

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
* __thiscall
iffl::
flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
::operator++(flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
             *this)

{
  size_t sVar1;
  size_with_padding<8UL> local_20;
  size_with_padding_t element_size;
  size_t next_offset;
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  *this_local;
  
  element_size.size =
       flat_forward_list_traits_traits<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
       ::get_next_offset(this->p_);
  if (element_size.size == 0) {
    local_20.size =
         (size_t)flat_forward_list_traits_traits<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                 ::get_size(this->p_);
    sVar1 = size_with_padding<8UL>::size_padded(&local_20);
    this->p_ = this->p_ + sVar1;
  }
  else {
    this->p_ = this->p_ + element_size.size;
  }
  return this;
}

Assistant:

constexpr flat_forward_list_iterator_t &operator++() noexcept {
        size_t const next_offset = traits_traits::get_next_offset(p_);
        if (0 == next_offset) {
            size_with_padding_t const element_size{ traits_traits::get_size(p_) };
            p_ += element_size.size_padded();
        } else {
            p_ += next_offset;
        }
        return *this;
    }